

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sstring_view_archive.hpp
# Opt level: O0

void pstore::serialize::serializer<pstore::sstring_view<std::shared_ptr<char_const>>,void>::
     readsv<pstore::serialize::archive::database_reader&>(database_reader *archive,value_type *str)

{
  size_t __return_storage_ptr__;
  database *db;
  address a;
  typed_address<char> local_28;
  size_t local_20;
  size_t length;
  value_type *str_local;
  database_reader *archive_local;
  
  length = (size_t)str;
  str_local = (value_type *)archive;
  local_20 = string_helper::read_length<pstore::serialize::archive::database_reader&>(archive);
  __return_storage_ptr__ = length;
  db = serialize::archive::database_reader::get_db((database_reader *)str_local);
  a = serialize::archive::database_reader::get_address((database_reader *)str_local);
  typed_address<char>::typed_address(&local_28,a);
  read_string_view((sstring_view<std::shared_ptr<const_char>_> *)__return_storage_ptr__,db,local_28,
                   local_20);
  serialize::archive::database_reader::skip((database_reader *)str_local,local_20);
  return;
}

Assistant:

static void readsv (DBReader && archive, value_type & str) {
                std::size_t const length =
                    string_helper::read_length (std::forward<DBReader> (archive));
                new (&str) value_type (read_string_view (
                    archive.get_db (), typed_address<char> (archive.get_address ()), length));
                archive.skip (length);
            }